

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O2

void __thiscall
chrono::utils::Generator::CreateObjectsCylinderX
          (Generator *this,Sampler<double> *sampler,ChVector<double> *pos,float radius,
          float halfHeight,ChVector<double> *vel)

{
  int iVar1;
  float fVar2;
  undefined4 in_XMM0_Db;
  double dVar3;
  PointVector points;
  _Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_40;
  
  fVar2 = radius;
  normalizeMixture(this);
  (*sampler->_vptr_Sampler[2])(sampler);
  iVar1 = (*(this->m_system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                    ();
  if (iVar1 == 1) {
    dVar3 = calcMinSeparation(this,(double)CONCAT44(in_XMM0_Db,fVar2));
  }
  else {
    dVar3 = (double)CONCAT44(in_XMM0_Db,fVar2);
  }
  (*sampler->_vptr_Sampler[3])(dVar3,sampler);
  Sampler<double>::SampleCylinderX
            ((PointVector *)&local_40,sampler,pos,(double)radius,(double)halfHeight);
  createObjects(this,(PointVector *)&local_40,vel);
  std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
  ~_Vector_base(&local_40);
  return;
}

Assistant:

void Generator::CreateObjectsCylinderX(Sampler<double>& sampler,
                                       const ChVector<>& pos,
                                       float radius,
                                       float halfHeight,
                                       const ChVector<>& vel) {
    // Normalize the mixture ratios
    normalizeMixture();

    // Generate the object locations
    double sep = sampler.GetSeparation();
    if (m_system->GetContactMethod() == ChContactMethod::SMC)
        sep = calcMinSeparation(sep);
    sampler.SetSeparation(sep);

    PointVector points = sampler.SampleCylinderX(pos, radius, halfHeight);
    createObjects(points, vel);
}